

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O1

void ga_sort_gath(Integer *pn,Integer *i,Integer *j,Integer *base)

{
  long lVar1;
  undefined8 uVar2;
  Integer IVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Integer *pIVar11;
  ulong uVar12;
  long lVar13;
  
  uVar9 = *pn;
  if (1 < (long)uVar9) {
    uVar8 = uVar9 >> 1;
    lVar4 = uVar9 * 8 + -8;
    if (uVar8 != 1) {
      do {
        plVar7 = base + (uVar8 - 1);
        uVar12 = uVar8;
        for (plVar6 = base + (uVar8 - 1) + uVar8; plVar6 <= base + (uVar9 - 1);
            plVar6 = plVar6 + uVar12) {
          uVar12 = uVar12 * 2;
          if (plVar6 != base + (uVar9 - 1)) {
            plVar5 = plVar6 + 1;
            if (plVar6[1] <= *plVar6) {
              plVar5 = plVar6;
            }
            uVar12 = uVar12 | *plVar6 < plVar6[1];
            plVar6 = plVar5;
          }
          lVar1 = *plVar7;
          if (*plVar6 <= lVar1) break;
          lVar13 = (long)plVar6 - (long)base;
          *plVar7 = *plVar6;
          lVar10 = (long)plVar7 - (long)base;
          *plVar6 = lVar1;
          uVar2 = *(undefined8 *)((long)i + lVar10);
          *(undefined8 *)((long)i + lVar10) = *(undefined8 *)((long)i + lVar13);
          *(undefined8 *)((long)i + lVar13) = uVar2;
          uVar2 = *(undefined8 *)((long)j + lVar10);
          *(undefined8 *)((long)j + lVar10) = *(undefined8 *)((long)j + lVar13);
          *(undefined8 *)((long)j + lVar13) = uVar2;
          plVar7 = plVar6;
        }
        uVar8 = uVar8 - 1;
      } while (uVar8 != 1);
    }
    if (lVar4 != 0) {
      do {
        if (7 < lVar4) {
          uVar9 = 1;
          plVar7 = base + 1;
          pIVar11 = base;
          do {
            uVar9 = uVar9 * 2;
            plVar6 = plVar7;
            if (plVar7 != (long *)((long)base + lVar4)) {
              plVar6 = plVar7 + 1;
              if (plVar7[1] <= *plVar7) {
                plVar6 = plVar7;
              }
              uVar9 = uVar9 | *plVar7 < plVar7[1];
            }
            lVar1 = *pIVar11;
            if (*plVar6 <= lVar1) break;
            lVar13 = (long)plVar6 - (long)base;
            *pIVar11 = *plVar6;
            lVar10 = (long)pIVar11 - (long)base;
            *plVar6 = lVar1;
            uVar2 = *(undefined8 *)((long)i + lVar10);
            *(undefined8 *)((long)i + lVar10) = *(undefined8 *)((long)i + lVar13);
            *(undefined8 *)((long)i + lVar13) = uVar2;
            uVar2 = *(undefined8 *)((long)j + lVar10);
            *(undefined8 *)((long)j + lVar10) = *(undefined8 *)((long)j + lVar13);
            *(undefined8 *)((long)j + lVar13) = uVar2;
            plVar7 = plVar6 + uVar9;
            pIVar11 = plVar6;
          } while (plVar7 <= (long *)((long)base + lVar4));
        }
        IVar3 = *base;
        *base = *(Integer *)((long)base + lVar4);
        *(Integer *)((long)base + lVar4) = IVar3;
        IVar3 = *i;
        *i = *(Integer *)((long)i + lVar4);
        *(Integer *)((long)i + lVar4) = IVar3;
        IVar3 = *j;
        *j = *(Integer *)((long)j + lVar4);
        *(Integer *)((long)j + lVar4) = IVar3;
        lVar4 = lVar4 + -8;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

void ga_sort_gath(pn, i, j, base)
     Integer *pn;
     Integer *i;
     Integer *j;
     Integer *base;
{

  if (*pn < 2) return;
  
#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    ltmp=i[ia]; i[ia]=i[ib]; i[ib]=ltmp; \
    ltmp=j[ia]; j[ia]=j[ib]; j[ib]=ltmp; \
  }
  INDEX_SORT(base,pn,SWAP);
}